

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cpp
# Opt level: O0

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  int err;
  size_t x;
  size_t remain;
  size_t n;
  size_t len_local;
  char *logline_local;
  AppendFile *this_local;
  
  remain = write(this,(int)logline,(void *)len,in_RCX);
  while( true ) {
    x = len - remain;
    if (x == 0) {
      return;
    }
    sVar2 = write(this,(int)logline + (int)remain,(void *)x,in_RCX);
    if (sVar2 == 0) break;
    remain = sVar2 + remain;
  }
  iVar1 = ferror((FILE *)this->fp_);
  if (iVar1 == 0) {
    return;
  }
  fprintf(_stderr,"AppendFile::append() failed !\n");
  return;
}

Assistant:

void AppendFile::append(const char* logline, const size_t len) {
  size_t n = this->write(logline, len);
  size_t remain = len - n;
  while (remain > 0) {
    size_t x = this->write(logline + n, remain);
    if (x == 0) {
      int err = ferror(fp_);
      if (err) fprintf(stderr, "AppendFile::append() failed !\n");
      break;
    }
    n += x;
    remain = len - n;
  }
}